

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::GetColumnWidth(int column_index)

{
  ImGuiColumnData *pIVar1;
  ImVec2 IVar2;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  int in_stack_ffffffffffffffcc;
  float i;
  ImGuiColumns *columns_00;
  float local_28;
  float local_4;
  
  columns_00 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (columns_00 == (ImGuiColumns *)0x0) {
    IVar2 = GetContentRegionAvail();
    local_28 = IVar2.x;
    local_4 = local_28;
  }
  else {
    pIVar1 = ImVector<ImGuiColumnData>::operator[]
                       ((ImVector<ImGuiColumnData> *)columns_00,in_stack_ffffffffffffffcc);
    i = pIVar1->OffsetNorm;
    pIVar1 = ImVector<ImGuiColumnData>::operator[]((ImVector<ImGuiColumnData> *)columns_00,(int)i);
    local_4 = GetColumnOffsetFromNorm(columns_00,i - pIVar1->OffsetNorm);
  }
  return local_4;
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (columns == NULL)
        return GetContentRegionAvail().x;

    if (column_index < 0)
        column_index = columns->Current;
    return GetColumnOffsetFromNorm(columns, columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm);
}